

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DRAIN_LIGHT(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t slot;
  object *poVar3;
  object *obj;
  wchar_t light_slot;
  wchar_t drain;
  effect_handler_context_t_conflict *context_local;
  
  wVar2 = effect_calculate_value(context,false);
  slot = slot_by_name(player,"light");
  poVar3 = slot_object(player,slot);
  if (poVar3 != (object *)0x0) {
    _Var1 = flag_has_dbg(poVar3->flags,6,0x19,"obj->flags","OF_NO_FUEL");
    if ((!_Var1) && (0 < poVar3->timeout)) {
      poVar3->timeout = poVar3->timeout - (short)wVar2;
      if (poVar3->timeout < 1) {
        poVar3->timeout = 1;
      }
      if (player->timed[2] == 0) {
        msg("Your light dims.");
        context->ident = true;
      }
      player->upkeep->redraw = player->upkeep->redraw | 0x40000;
    }
  }
  return true;
}

Assistant:

bool effect_handler_DRAIN_LIGHT(effect_handler_context_t *context)
{
	int drain = effect_calculate_value(context, false);

	int light_slot = slot_by_name(player, "light");
	struct object *obj = slot_object(player, light_slot);

	if (obj && !of_has(obj->flags, OF_NO_FUEL) && (obj->timeout > 0)) {
		/* Reduce fuel */
		obj->timeout -= drain;
		if (obj->timeout < 1) obj->timeout = 1;

		/* Notice */
		if (!player->timed[TMD_BLIND]) {
			msg("Your light dims.");
			context->ident = true;
		}

		/* Redraw stuff */
		player->upkeep->redraw |= (PR_EQUIP);
	}

	return true;
}